

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxbmhandler.cpp
# Opt level: O2

bool QXbmHandler::canRead(QIODevice *device)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  QLoggingCategory *pQVar4;
  long in_FS_OFFSET;
  int h;
  int w;
  QImage local_48;
  char *local_30;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    pQVar4 = QtPrivateLogging::lcImageIo();
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_30 = pQVar4->name;
      local_48.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 2;
      local_48.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0;
      local_48.super_QPaintDevice.painters = 0;
      local_48.super_QPaintDevice._10_2_ = 0;
      local_48.super_QPaintDevice._12_4_ = 0;
      local_48.d._0_4_ = 0;
      local_48.d._4_4_ = 0;
      bVar2 = false;
      QMessageLogger::warning((char *)&local_48,"QXbmHandler::canRead() called with no device");
      goto LAB_0029753b;
    }
  }
  else {
    cVar1 = (**(code **)(*(long *)device + 0x60))();
    if (cVar1 == '\0') {
      local_48.d._0_4_ = 0xaaaaaaaa;
      local_48.d._4_4_ = 0xaaaaaaaa;
      local_48.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
      local_48.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
      local_48.super_QPaintDevice.painters = 0xaaaa;
      local_48.super_QPaintDevice._10_2_ = 0xaaaa;
      local_48.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
      QImage::QImage(&local_48);
      uVar3 = (**(code **)(*(long *)device + 0x78))(device);
      local_24 = 0;
      local_28 = 0;
      bVar2 = read_xbm_header(device,&local_24,&local_28);
      if (bVar2) {
        bVar2 = read_xbm_body(device,local_24,local_28,&local_48);
      }
      else {
        bVar2 = false;
      }
      (**(code **)(*(long *)device + 0x88))(device,uVar3);
      QImage::~QImage(&local_48);
      goto LAB_0029753b;
    }
  }
  bVar2 = false;
LAB_0029753b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QXbmHandler::canRead(QIODevice *device)
{
    if (!device) {
        qCWarning(lcImageIo, "QXbmHandler::canRead() called with no device");
        return false;
    }

    // it's impossible to tell whether we can load an XBM or not when
    // it's from a sequential device, as the only way to do it is to
    // attempt to parse the whole image.
    if (device->isSequential())
        return false;

    QImage image;
    qint64 oldPos = device->pos();
    bool success = read_xbm_image(device, &image);
    device->seek(oldPos);

    return success;
}